

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmParser.cpp
# Opt level: O2

bool __thiscall
ArmParser::parseShift(ArmParser *this,Parser *parser,ArmOpcodeVariables *vars,bool immediateOnly)

{
  char cVar1;
  bool bVar2;
  Token *pTVar3;
  string *psVar4;
  uchar uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  int64_t multiplier;
  string stringValue;
  Expression local_48;
  
  (vars->Shift).UseShift = false;
  pTVar3 = Parser::peekToken(parser,0);
  if (pTVar3->type != Comma) {
    return true;
  }
  Parser::eatToken(parser);
  pTVar3 = Parser::nextToken(parser);
  if (pTVar3->type != Identifier) {
    return false;
  }
  psVar4 = (string *)Token::identifierValue(pTVar3);
  std::__cxx11::string::string((string *)&stringValue,psVar4);
  cVar1 = stringValue._M_dataplus._M_p[stringValue._M_string_length - 1];
  bVar8 = cVar1 - 0x30;
  if (bVar8 < 10) {
    while ((byte)(cVar1 - 0x30U) < 10) {
      std::__cxx11::string::pop_back();
      cVar1 = stringValue._M_dataplus._M_p[stringValue._M_string_length - 1];
    }
  }
  __lhs = &stringValue;
  bVar2 = std::operator==(__lhs,"lsl");
  if (bVar2) {
LAB_00153d9e:
    uVar5 = '\0';
LAB_00153da0:
    (vars->Shift).Type = uVar5;
    if (bVar8 < 10) {
      createConstExpression((int64_t)stringValue._M_dataplus._M_p);
      Expression::operator=(&(vars->Shift).ShiftExpression,&local_48);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_48.expression.
                  super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      bVar6 = false;
    }
    else {
      bVar2 = parseRegister((ArmParser *)__lhs,parser,&(vars->Shift).reg,0xf);
      if (bVar2) {
        bVar6 = true;
        if (immediateOnly) goto LAB_00153e13;
      }
      else {
        pTVar3 = Parser::peekToken(parser,0);
        if (pTVar3->type == Hash) {
          Parser::eatToken(parser);
        }
        bVar2 = parseImmediate(this,parser,&(vars->Shift).ShiftExpression);
        bVar7 = false;
        bVar6 = false;
        if (!bVar2) goto LAB_00153ddc;
      }
    }
    (vars->Shift).ShiftByRegister = bVar6;
    (vars->Shift).UseShift = true;
    bVar7 = true;
  }
  else {
    __lhs = &stringValue;
    bVar2 = std::operator==(__lhs,"asl");
    if (bVar2) goto LAB_00153d9e;
    __lhs = &stringValue;
    bVar2 = std::operator==(__lhs,"lsr");
    uVar5 = '\x01';
    if (bVar2) goto LAB_00153da0;
    __lhs = &stringValue;
    bVar2 = std::operator==(__lhs,"asr");
    uVar5 = '\x02';
    if (bVar2) goto LAB_00153da0;
    __lhs = &stringValue;
    bVar2 = std::operator==(__lhs,"ror");
    uVar5 = '\x03';
    if (bVar2) goto LAB_00153da0;
    __lhs = &stringValue;
    bVar2 = std::operator==(__lhs,"rrx");
    uVar5 = '\x04';
    if (bVar2) goto LAB_00153da0;
LAB_00153e13:
    bVar7 = false;
  }
LAB_00153ddc:
  std::__cxx11::string::~string((string *)&stringValue);
  return bVar7;
}

Assistant:

bool ArmParser::parseShift(Parser& parser, ArmOpcodeVariables& vars, bool immediateOnly)
{
	// no shift is also valid
	vars.Shift.UseShift = false;
	if (parser.peekToken().type != TokenType::Comma)
		return true;

	parser.eatToken();

	// load shift mode
	const Token& shiftMode = parser.nextToken();
	if (shiftMode.type != TokenType::Identifier)
		return false;

	std::string stringValue = shiftMode.identifierValue().string();
	
	bool hasNumber = isNumber(stringValue.back());
	int64_t number = 0;

	// handle modeXX syntax
	if (hasNumber)
	{
		int64_t multiplier = 1;
		while (isNumber(stringValue.back()))
		{
			number += multiplier*(stringValue.back() - '0');
			multiplier *= 10;
			stringValue.pop_back();
		}
	}

	if (stringValue == "lsl" || stringValue == "asl")
		vars.Shift.Type = 0;
	else if (stringValue == "lsr")
		vars.Shift.Type = 1;
	else if (stringValue == "asr")
		vars.Shift.Type = 2;
	else if (stringValue == "ror")
		vars.Shift.Type = 3;
	else if (stringValue == "rrx")
		vars.Shift.Type = 4;
	else 
		return false;

	if (hasNumber)
	{
		vars.Shift.ShiftExpression = createConstExpression(number);
		vars.Shift.ShiftByRegister = false;
	} else if (parseRegister(parser,vars.Shift.reg))
	{
		if (immediateOnly)
			return false;

		vars.Shift.ShiftByRegister = true;
	} else {
		if (parser.peekToken().type == TokenType::Hash)
			parser.eatToken();
		
		if (!parseImmediate(parser,vars.Shift.ShiftExpression))
			return false;

		vars.Shift.ShiftByRegister = false;
	}
	
	vars.Shift.UseShift = true;
	return true;
}